

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Deserializer::GetAbsoluteSteps
          (BP5Deserializer *this,VariableBase *Var,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *keys)

{
  BP5Deserializer *pBVar1;
  size_t sVar2;
  void *pvVar3;
  size_t in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  BP5VarRec *unaff_retaddr;
  BP5Deserializer *in_stack_00000008;
  MetaArrayRec *writer_meta_base;
  size_t WriterRank;
  size_t Step;
  BP5VarRec *VarRec;
  void *in_stack_ffffffffffffffa8;
  BP5Deserializer *in_stack_ffffffffffffffb0;
  size_t sVar4;
  BP5Deserializer *this_00;
  size_t local_30;
  BP5Deserializer *local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *Step_00;
  
  Step_00 = in_RDI;
  LookupVarByKey(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (((ulong)in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 1) != 0) {
    local_28 = (BP5Deserializer *)0x0;
    while (this_00 = local_28,
          pBVar1 = (BP5Deserializer *)
                   std::
                   vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                   ::size((vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                           *)(in_RDI + 10)), this_00 < pBVar1) {
      local_30 = 0;
      while (sVar4 = local_30, sVar2 = WriterCohortSize(this_00,local_30), sVar4 < sVar2) {
        pvVar3 = GetMetadataBase(in_stack_00000008,unaff_retaddr,(size_t)Step_00,in_RSI);
        if (pvVar3 != (void *)0x0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (in_RDI,(value_type *)this_00);
          break;
        }
        local_30 = local_30 + 1;
      }
      local_28 = (BP5Deserializer *)((long)&local_28->_vptr_BP5Deserializer + 1);
    }
  }
  return;
}

Assistant:

void BP5Deserializer::GetAbsoluteSteps(const VariableBase &Var, std::vector<size_t> &keys) const
{
    BP5VarRec *VarRec = LookupVarByKey((void *)&Var);
    if (!m_RandomAccessMode)
        return;

    for (size_t Step = 0; Step < m_ControlArray.size(); Step++)
    {
        for (size_t WriterRank = 0; WriterRank < WriterCohortSize(Step); WriterRank++)
        {
            MetaArrayRec *writer_meta_base =
                (MetaArrayRec *)GetMetadataBase(VarRec, Step, WriterRank);
            if (writer_meta_base)
            {
                keys.push_back(Step);
                break;
            }
        }
    }
}